

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O0

void TemplateCacheUnittest::TestRecursiveInclude(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  allocator local_1b9;
  string local_1b8 [32];
  TemplateString local_198;
  TemplateString local_178;
  TemplateString local_158;
  TemplateDictionary local_138 [8];
  TemplateDictionary dict;
  TemplateString local_c8;
  long local_a8;
  Template *tpl;
  allocator local_89;
  string local_88 [32];
  ctemplate local_68 [8];
  string incname;
  undefined1 local_48 [8];
  TemplateCache cache;
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hi {{>INC}} bar\n  {{>INC}}!",&local_89);
  ctemplate::StringToTemplateFile(local_68,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  ctemplate::TemplateString::TemplateString(&local_c8,(string *)local_68);
  local_a8 = ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_c8);
  if (local_a8 != 0) {
    ctemplate::TemplateString::TemplateString(&local_158,"dict");
    ctemplate::TemplateDictionary::TemplateDictionary(local_138,&local_158,(UnsafeArena *)0x0);
    ctemplate::TemplateString::TemplateString(&local_178,"INC");
    TVar1.length_ = local_178.length_;
    TVar1.ptr_ = local_178.ptr_;
    TVar1.is_immutable_ = local_178.is_immutable_;
    TVar1._17_7_ = local_178._17_7_;
    TVar1.id_ = local_178.id_;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
    ctemplate::TemplateString::TemplateString(&local_198,(string *)local_68);
    TVar2.length_ = local_198.length_;
    TVar2.ptr_ = local_198.ptr_;
    TVar2.is_immutable_ = local_198.is_immutable_;
    TVar2._17_7_ = local_198._17_7_;
    TVar2.id_ = local_198.id_;
    ctemplate::TemplateDictionary::SetFilename(TVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"hi hi  bar\n  ! bar\n  hi  bar\n    !!",&local_1b9);
    ctemplate::AssertExpandWithCacheIs
              ((TemplateCache *)local_48,(string *)local_68,DO_NOT_STRIP,local_138,
               (PerExpandData *)0x0,(string *)local_1b8,true);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_138);
    std::__cxx11::string::~string((string *)local_68);
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_48);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x390,"tpl");
  if (local_a8 != 0) {
    exit(1);
  }
  __assert_fail("tpl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                ,0x390,"static void TemplateCacheUnittest::TestRecursiveInclude()");
}

Assistant:

static void TestRecursiveInclude() {
    TemplateCache cache;
    string incname = StringToTemplateFile("hi {{>INC}} bar\n  {{>INC}}!");
    const Template* tpl = cache.GetTemplate(incname, DO_NOT_STRIP);
    ASSERT(tpl);
    TemplateDictionary dict("dict");
    dict.AddIncludeDictionary("INC")->SetFilename(incname);
    // Note the last line is indented 4 spaces instead of 2.  This is
    // because the last sub-include is indented.
    AssertExpandWithCacheIs(&cache, incname, DO_NOT_STRIP, &dict, NULL,
                            "hi hi  bar\n  ! bar\n  hi  bar\n    !!",
                            true);
  }